

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O1

ON_2dVector __thiscall ON_Ellipse::GradientAt(ON_Ellipse *this,ON_2dPoint *p)

{
  double dVar1;
  double dVar2;
  ON_2dVector OVar3;
  ON_2dVector OVar4;
  
  dVar1 = this->radius[0];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = this->radius[1];
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      OVar3.x = (p->x + p->x) / (dVar1 * dVar1);
      OVar3.y = (p->y + p->y) / (dVar2 * dVar2);
      return OVar3;
    }
  }
  OVar4.y = ON_2dVector::ZeroVector.y;
  OVar4.x = ON_2dVector::ZeroVector.x;
  return OVar4;
}

Assistant:

ON_2dVector ON_Ellipse::GradientAt( 
                 const ON_2dPoint& p // coordinates in plane
                 ) const
{
  ON_2dVector g;
  if ( radius[0] != 0.0 && radius[1] != 0.0 ) {
    g.x = 2.0*p.x/(radius[0]*radius[0]);
    g.y = 2.0*p.y/(radius[1]*radius[1]);
  }
  else {
    g = ON_2dVector::ZeroVector;
  }
  return g;
}